

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O0

void __thiscall
bloaty::RangeSink::AddVMRange
          (RangeSink *this,char *analyzer,uint64_t vmaddr,uint64_t vmsize,string *name)

{
  string_view format;
  bool bVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  RangeSink *in_RDX;
  Arg *in_RSI;
  long in_RDI;
  string *in_R8;
  bool ok;
  string label;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *pair;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
  *__range1;
  bool verbose;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe60;
  DataSource in_stack_fffffffffffffe64;
  char *in_stack_fffffffffffffe68;
  Arg *this_00;
  Arg *in_stack_fffffffffffffe88;
  Arg *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffe9c;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  RangeMap *in_stack_fffffffffffffeb0;
  string *in_stack_fffffffffffffeb8;
  uint64_t in_stack_fffffffffffffec0;
  uint64_t in_stack_fffffffffffffec8;
  RangeMap *in_stack_fffffffffffffed0;
  RangeMap *in_stack_fffffffffffffee0;
  string local_b8 [16];
  NameMunger *in_stack_ffffffffffffff58;
  string_view in_stack_ffffffffffffff60;
  string local_70 [32];
  reference local_50;
  pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *local_48;
  __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
  local_40;
  long local_38;
  undefined1 local_29;
  
  local_29 = IsVerboseForVMRange(in_RDX,(uint64_t)in_RCX,(uint64_t)in_R8);
  if ((bool)local_29) {
    in_stack_fffffffffffffe88 = (Arg *)GetDataSourceLabel(in_stack_fffffffffffffe64);
    in_stack_fffffffffffffe9c = std::__cxx11::string::size();
    in_stack_fffffffffffffe58 = in_RCX;
    uVar2 = std::__cxx11::string::data();
    printf("[%s, %s] AddVMRange(%.*s, %lx, %lx)\n",in_stack_fffffffffffffe88,in_RSI,
           (ulong)in_stack_fffffffffffffe9c,uVar2,in_RDX);
    in_stack_fffffffffffffe90 = in_RSI;
  }
  if (*(long *)(in_RDI + 0xf0) == 0) {
    __assert_fail("translator_",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/bloaty.cc",
                  0x50a,
                  "void bloaty::RangeSink::AddVMRange(const char *, uint64_t, uint64_t, const std::string &)"
                 );
  }
  local_38 = in_RDI + 0xf8;
  local_40._M_current =
       (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
       std::
       vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
       ::begin((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                *)in_stack_fffffffffffffe58);
  local_48 = (pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*> *)
             std::
             vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
             ::end((vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>
                    *)in_stack_fffffffffffffe58);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                            (__normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
                             *)in_stack_fffffffffffffe58), bVar1) {
    local_50 = __gnu_cxx::
               __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
               ::operator*(&local_40);
    this_00 = (Arg *)local_50->second;
    std::__cxx11::string::operator_cast_to_basic_string_view(in_R8);
    NameMunger::Munge_abi_cxx11_(in_stack_ffffffffffffff58,in_stack_ffffffffffffff60);
    in_stack_fffffffffffffe58 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         &local_50->first->file_map;
    bVar1 = RangeMap::AddRangeWithTranslation
                      (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0
                       ,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
                       (bool)in_stack_fffffffffffffeaf,in_stack_fffffffffffffee0);
    if ((!bVar1) && (0 < verbose_level)) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&this_00->piece_,in_stack_fffffffffffffe68);
      absl::substitute_internal::Arg::Arg(this_00,(unsigned_long)in_stack_fffffffffffffe68);
      absl::substitute_internal::Arg::Arg(this_00,(unsigned_long)in_stack_fffffffffffffe68);
      in_stack_fffffffffffffe68 = &stack0xfffffffffffffea8;
      absl::substitute_internal::Arg::Arg<std::allocator<char>>
                ((Arg *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      format._M_str._0_7_ = in_stack_fffffffffffffea8;
      format._M_len = in_RDI;
      format._M_str._7_1_ = in_stack_fffffffffffffeaf;
      absl::Substitute_abi_cxx11_
                (format,(Arg *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                 in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      uVar2 = std::__cxx11::string::c_str();
      printf("WARNING: %s\n",uVar2);
      std::__cxx11::string::~string(local_b8);
    }
    std::__cxx11::string::~string(local_70);
    __gnu_cxx::
    __normal_iterator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_*,_std::vector<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>,_std::allocator<std::pair<bloaty::DualMap_*,_const_bloaty::NameMunger_*>_>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void RangeSink::AddVMRange(const char* analyzer, uint64_t vmaddr,
                           uint64_t vmsize, const std::string& name) {
  bool verbose = IsVerboseForVMRange(vmaddr, vmsize);
  if (verbose) {
    printf("[%s, %s] AddVMRange(%.*s, %" PRIx64 ", %" PRIx64 ")\n",
           GetDataSourceLabel(data_source_), analyzer, (int)name.size(),
           name.data(), vmaddr, vmsize);
  }
  assert(translator_);
  for (auto& pair : outputs_) {
    const std::string label = pair.second->Munge(name);
    bool ok = pair.first->vm_map.AddRangeWithTranslation(
        vmaddr, vmsize, label, translator_->vm_map, verbose,
        &pair.first->file_map);
    if (!ok) {
      WARN("VM range ($0, $1) for label $2 extends beyond base map", vmaddr,
           vmsize, name);
    }
  }
}